

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticEngine.cpp
# Opt level: O3

string * __thiscall
slang::DiagnosticEngine::formatMessage_abi_cxx11_
          (string *__return_storage_ptr__,DiagnosticEngine *this,Diagnostic *diag)

{
  uchar uVar1;
  element_type *peVar2;
  pointer pvVar3;
  uint uVar4;
  ushort uVar5;
  char_pointer puVar6;
  char_pointer puVar7;
  long lVar8;
  undefined8 *puVar9;
  uint uVar10;
  char_pointer puVar11;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  pointer pvVar13;
  char_pointer puVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  string_view sVar17;
  iterator iVar18;
  format_args args_00;
  string_view fmt;
  dynamic_format_arg_store<fmt::v11::context> args;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  long *local_48;
  anon_class_16_2_3fddba98 local_40;
  table_element_pointer ppVar12;
  
  if ((diag->args).
      super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (diag->args).
      super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    sVar17 = getMessage(this,diag->code);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,sVar17._M_str,sVar17._M_str + sVar17._M_len);
  }
  else {
    if ((this->formatters).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>,_slang::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>_>_>
        .size_ctrl.size == 0) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>_>_>
      ::operator=((table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>_>_>
                   *)&this->formatters,
                  (table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>_>_>
                   *)&defaultFormatters);
    }
    iVar18 = boost::unordered::detail::foa::
             table<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>_>_>
             ::begin(&(this->formatters).table_);
    ppVar12 = iVar18.p_;
    if (ppVar12 != (table_element_pointer)0x0) {
LAB_001a8b82:
      do {
        puVar14 = iVar18.pc_;
        peVar2 = (ppVar12->second).
                 super___shared_ptr<slang::DiagArgFormatter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        (*peVar2->_vptr_DiagArgFormatter[2])(peVar2,diag);
        puVar11 = puVar14 + 0x12;
        puVar6 = puVar14 + 2;
LAB_001a8b9f:
        puVar7 = puVar6;
        ppVar12 = ppVar12 + 1;
        if (((uint)puVar14 & 0xf) != 0xe) goto code_r0x001a8bae;
        auVar15[0] = -(*puVar7 == '\0');
        auVar15[1] = -(puVar7[1] == '\0');
        auVar15[2] = -(puVar7[2] == '\0');
        auVar15[3] = -(puVar7[3] == '\0');
        auVar15[4] = -(puVar7[4] == '\0');
        auVar15[5] = -(puVar7[5] == '\0');
        auVar15[6] = -(puVar7[6] == '\0');
        auVar15[7] = -(puVar7[7] == '\0');
        auVar15[8] = -(puVar7[8] == '\0');
        auVar15[9] = -(puVar7[9] == '\0');
        auVar15[10] = -(puVar7[10] == '\0');
        auVar15[0xb] = -(puVar7[0xb] == '\0');
        auVar15[0xc] = -(puVar7[0xc] == '\0');
        auVar15[0xd] = -(puVar7[0xd] == '\0');
        auVar15[0xe] = -(puVar7[0xe] == '\0');
        auVar15[0xf] = -(puVar7[0xf] == '\0');
        uVar5 = (ushort)(SUB161(auVar15 >> 7,0) & 1) | (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe;
        while (uVar5 == 0x7fff) {
          ppVar12 = ppVar12 + 0xf;
          auVar16[0] = -(*puVar11 == '\0');
          auVar16[1] = -(puVar11[1] == '\0');
          auVar16[2] = -(puVar11[2] == '\0');
          auVar16[3] = -(puVar11[3] == '\0');
          auVar16[4] = -(puVar11[4] == '\0');
          auVar16[5] = -(puVar11[5] == '\0');
          auVar16[6] = -(puVar11[6] == '\0');
          auVar16[7] = -(puVar11[7] == '\0');
          auVar16[8] = -(puVar11[8] == '\0');
          auVar16[9] = -(puVar11[9] == '\0');
          auVar16[10] = -(puVar11[10] == '\0');
          auVar16[0xb] = -(puVar11[0xb] == '\0');
          auVar16[0xc] = -(puVar11[0xc] == '\0');
          auVar16[0xd] = -(puVar11[0xd] == '\0');
          auVar16[0xe] = -(puVar11[0xe] == '\0');
          auVar16[0xf] = -(puVar11[0xf] == '\0');
          puVar7 = puVar11;
          puVar11 = puVar11 + 0x10;
          uVar5 = (ushort)(SUB161(auVar16 >> 7,0) & 1) | (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1
                  | (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe;
        }
        uVar10 = uVar5 ^ 0x7fff;
        uVar4 = 0;
        if (uVar10 != 0) {
          for (; (uVar10 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
          }
        }
        if (puVar7[uVar4] == '\x01') break;
        ppVar12 = ppVar12 + uVar4;
        iVar18.p_._0_2_ = uVar5;
        iVar18.pc_ = puVar7 + uVar4;
        iVar18.p_._2_6_ = 0;
      } while( true );
    }
LAB_001a8c28:
    local_58 = (undefined1  [16])0x0;
    local_68 = (undefined1  [16])0x0;
    local_78 = (undefined1  [16])0x0;
    local_48 = (long *)0x0;
    pvVar13 = (diag->args).
              super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pvVar3 = (diag->args).
             super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pvVar13 != pvVar3) {
      do {
        lVar8 = (long)(char)(pvVar13->
                            super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>
                            ).
                            super__Move_assign_alias<std::__cxx11::basic_string<char>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>
                            .
                            super__Copy_assign_alias<std::__cxx11::basic_string<char>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>
                            .
                            super__Move_ctor_alias<std::__cxx11::basic_string<char>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>
                            .
                            super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>
                            .
                            super__Variant_storage_alias<std::__cxx11::basic_string<char>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>
                            ._M_index;
        local_40.this = this;
        if (lVar8 == -1) {
          local_40.args = (dynamic_format_arg_store<fmt::v11::context> *)local_78;
          puVar9 = (undefined8 *)__cxa_allocate_exception(0x10);
          *puVar9 = &PTR__exception_0061ae68;
          puVar9[1] = "std::visit: variant is valueless";
          __cxa_throw(puVar9,&std::bad_variant_access::typeinfo,std::exception::~exception);
        }
        local_40.args = (dynamic_format_arg_store<fmt::v11::context> *)local_78;
        (*std::__detail::__variant::
          __gen_vtable<std::__detail::__variant::__deduce_visit_result<void>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/diagnostics/DiagnosticEngine.cpp:296:13)_&&,_const_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_&>
          ::_S_vtable._M_arr[lVar8]._M_data)(&local_40,pvVar13);
        pvVar13 = pvVar13 + 1;
      } while (pvVar13 != pvVar3);
    }
    sVar17 = getMessage(this,diag->code);
    args_00.desc_ = local_78._0_8_ + (ulong)(local_68._8_8_ != local_58._0_8_) * 0x20;
    fmt.size_ = (ulong)(local_68._8_8_ != local_58._0_8_) << 0x3e |
                (ulong)(local_78._8_8_ - local_78._0_8_) >> 5 & 0xffffffff | 0x8000000000000000;
    args_00.field_1.values_ = in_R9.values_;
    fmt.data_ = (char *)sVar17._M_len;
    ::fmt::v11::vformat_abi_cxx11_(__return_storage_ptr__,(v11 *)sVar17._M_str,fmt,args_00);
    if (local_48 != (long *)0x0) {
      (**(code **)(*local_48 + 8))();
    }
    local_48 = (long *)0x0;
    if ((void *)local_68._8_8_ != (void *)0x0) {
      operator_delete((void *)local_68._8_8_,local_58._8_8_ - local_68._8_8_);
    }
    if ((void *)local_78._0_8_ != (void *)0x0) {
      operator_delete((void *)local_78._0_8_,local_68._0_8_ - local_78._0_8_);
    }
  }
  return __return_storage_ptr__;
code_r0x001a8bae:
  uVar1 = puVar7[-1];
  puVar14 = puVar14 + 1;
  puVar11 = puVar11 + 1;
  puVar6 = puVar7 + 1;
  if (uVar1 != '\0') goto code_r0x001a8bbf;
  goto LAB_001a8b9f;
code_r0x001a8bbf:
  if (uVar1 == '\x01') goto LAB_001a8c28;
  iVar18.p_._0_1_ = uVar1;
  iVar18.pc_ = puVar7 + -1;
  iVar18.p_._1_7_ = 0;
  goto LAB_001a8b82;
}

Assistant:

std::string DiagnosticEngine::formatMessage(const Diagnostic& diag) const {
    // If we have no arguments, the format string is the entire message.
    if (diag.args.empty())
        return std::string(getMessage(diag.code));

    // Let each formatter have a look at the diagnostic before we begin.
    if (formatters.empty())
        formatters = defaultFormatters;

    for (auto& [key, formatter] : formatters)
        formatter->startMessage(diag);

    // Dynamically build up the list of arguments to pass to the formatting routines.
    fmt::dynamic_format_arg_store<fmt::format_context> args;
    for (auto& arg : diag.args) {
        // Unwrap the argument type (stored as a variant).
        std::visit(
            [&](auto&& t) {
                // If the argument is a pointer, the fmtlib API needs it unwrapped into a reference.
                using T = std::decay_t<decltype(t)>;
                if constexpr (std::is_same_v<Diagnostic::CustomArgType, T>) {
                    if (auto it = formatters.find(t.first); it != formatters.end())
                        args.push_back(it->second->format(t.second));
                    else
                        SLANG_THROW(std::runtime_error("No diagnostic formatter for type"));
                }
                else if constexpr (std::is_same_v<ConstantValue, T>) {
                    if (t.isReal())
                        args.push_back(double(t.real()));
                    else if (t.isShortReal())
                        args.push_back(float(t.shortReal()));
                    else
                        args.push_back(t.toString());
                }
                else {
                    args.push_back(t);
                }
            },
            arg);
    }

    return fmt::vformat(getMessage(diag.code), args);
}